

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

int __thiscall
CVmObjLookupTable::getp_set_def_val
          (CVmObjLookupTable *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  vm_lookup_ext *pvVar2;
  undefined8 in_RCX;
  vm_val_t *in_RDX;
  vm_obj_id_t in_ESI;
  CVmObjLookupTable *in_RDI;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  vm_val_t *in_stack_ffffffffffffffc8;
  vm_val_t *in_stack_ffffffffffffffd0;
  
  if ((getp_set_def_val(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_set_def_val(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_set_def_val::desc,1);
    __cxa_guard_release(&getp_set_def_val(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffffc8,(uint *)in_RDI,
                     (CVmNativeCodeDesc *)
                     CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (iVar1 == 0) {
    get_ext(in_RDI);
    add_undo_rec((CVmObjLookupTable *)in_RDX,(vm_obj_id_t)((ulong)in_RCX >> 0x20),
                 (lookuptab_undo_action)in_RCX,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    pvVar2 = get_ext(in_RDI);
    CVmStack::pop(&pvVar2->default_value);
    vm_val_t::set_obj(in_RDX,in_ESI);
  }
  return 1;
}

Assistant:

int CVmObjLookupTable::getp_set_def_val(VMG_ vm_obj_id_t self,
                                        vm_val_t *retval, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* save undo */
    add_undo_rec(vmg_ self, LOOKUPTAB_UNDO_DEFVAL,
                 0, &get_ext()->default_value);

    /* set the default value to the argument value */
    G_stk->pop(&get_ext()->default_value);

    /* return self */
    retval->set_obj(self);
    return TRUE;
}